

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

char * get_multiple_arg_token(char *arg)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  size_t sVar5;
  long lVar6;
  
  if (arg == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = strchr(arg,0x2c);
  lVar6 = 0;
  do {
    if (pcVar1 == (char *)0x0) {
      sVar5 = strlen(arg);
LAB_0012ced7:
      pcVar1 = (char *)malloc(sVar5 + lVar6 + 1);
      lVar2 = 0;
      for (uVar3 = 0; (cVar4 = arg[lVar2], cVar4 != '\0' && (uVar3 < sVar5 + lVar6));
          uVar3 = uVar3 + 1) {
        if (cVar4 == '\\') {
          if (arg[lVar2 + 1] == ',') {
            lVar2 = lVar2 + 1;
          }
          cVar4 = arg[lVar2];
        }
        lVar2 = lVar2 + 1;
        pcVar1[uVar3] = cVar4;
      }
      pcVar1[lVar6 + sVar5] = '\0';
      return pcVar1;
    }
    if (pcVar1[-1] != '\\') {
      sVar5 = (long)pcVar1 - (long)arg;
      goto LAB_0012ced7;
    }
    pcVar1 = strchr(pcVar1 + 1,0x2c);
    lVar6 = lVar6 + -1;
  } while( true );
}

Assistant:

static char *
get_multiple_arg_token(const char *arg)
{
  const char *tok;
  char *ret;
  size_t len, num_of_escape, i, j;

  if (!arg)
    return 0;

  tok = strchr (arg, ',');
  num_of_escape = 0;

  /* make sure it is not escaped */
  while (tok)
    {
      if (*(tok-1) == '\\')
        {
          /* find the next one */
          tok = strchr (tok+1, ',');
          ++num_of_escape;
        }
      else
        break;
    }

  if (tok)
    len = (size_t)(tok - arg + 1);
  else
    len = strlen (arg) + 1;

  len -= num_of_escape;

  ret = (char *) malloc (len);

  i = 0;
  j = 0;
  while (arg[i] && (j < len-1))
    {
      if (arg[i] == '\\' && 
	  arg[ i + 1 ] && 
	  arg[ i + 1 ] == ',')
        ++i;

      ret[j++] = arg[i++];
    }

  ret[len-1] = '\0';

  return ret;
}